

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::abc::ndf(abc *this,vec3 *wh)

{
  long lVar1;
  size_t sVar2;
  float *pfVar3;
  long in_RDX;
  float *extraout_RDX;
  double dVar4;
  value_type vVar5;
  int local_28;
  int i;
  vec3 *wh_local;
  abc *this_local;
  value_type *ndf;
  
  (**(code **)(*(long *)wh + 0x10))();
  for (local_28 = 0; sVar2 = std::valarray<float>::size((valarray<float> *)this),
      local_28 < (int)sVar2; local_28 = local_28 + 1) {
    lVar1 = *(long *)&wh[1].y;
    dVar4 = abc__ndf((double)*(float *)(in_RDX + 8),*(double *)(lVar1 + 0x20 + (long)local_28 * 8),
                     *(double *)(lVar1 + 0x38),*(double *)(lVar1 + 0x40));
    pfVar3 = std::valarray<float>::operator[]((valarray<float> *)this,(long)local_28);
    *pfVar3 = (float)dVar4;
  }
  vVar5._M_data = extraout_RDX;
  vVar5._M_size = (size_t)this;
  return vVar5;
}

Assistant:

brdf::value_type abc::ndf(const vec3 &wh) const
{
	brdf::value_type ndf = zero_value();

	for (int i = 0; i < (int)ndf.size(); ++i)
		ndf[i] = (float_t)abc__ndf((double)wh.z,
								   m_data->A[i],
								   m_data->B,
								   m_data->C);

	return ndf;
}